

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O0

unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
* __thiscall packing::AssignedProtos::uniqueColors(AssignedProtos *this)

{
  int iVar1;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *in_R9;
  Iter<__gnu_cxx::__normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::add_const_t>
  iter;
  const_iterator local_30;
  const_iterator local_20;
  AssignedProtos *local_10;
  AssignedProtos *this_local;
  
  local_10 = this;
  if (uniqueColors()::colors == '\0') {
    iVar1 = __cxa_guard_acquire(&uniqueColors()::colors);
    if (iVar1 != 0) {
      std::
      unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
      ::unordered_set(&uniqueColors::colors);
      __cxa_atexit(std::
                   unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                   ::~unordered_set,&uniqueColors::colors,&__dso_handle);
      __cxa_guard_release(&uniqueColors()::colors);
    }
  }
  std::
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  ::clear(&uniqueColors::colors);
  local_20 = begin(this);
  local_30 = end(this);
  iter._iter._M_current = (optional<packing::ProtoPalAttrs> *)&local_30;
  iter._array = (add_const_t<decltype(_assigned)> *)local_20._iter._M_current;
  addUniqueColors<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::add_const_t>>
            ((AssignedProtos *)&uniqueColors::colors,
             (unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
              *)local_20._array,iter,
             (Iter<__gnu_cxx::__normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::add_const_t>
              *)this->_protoPals,in_R9);
  return &uniqueColors::colors;
}

Assistant:

std::unordered_set<uint16_t> &uniqueColors() const {
		// We check for *distinct* colors by stuffing them into a `set`; this should be
		// faster than "back-checking" on every element (O(n²))
		//
		// TODO: calc84maniac suggested another approach; try implementing it, see if it
		// performs better:
		// > So basically you make a priority queue that takes iterators into each of your sets
		// > (paired with end iterators so you'll know where to stop), and the comparator tests the
		// > values pointed to by each iterator
		// > Then each iteration you pop from the queue,
		// > optionally add one to your count, increment the iterator and push it back into the
		// > queue if it didn't reach the end
		// > And you do this until the priority queue is empty
		static std::unordered_set<uint16_t> colors;

		colors.clear();
		addUniqueColors(colors, begin(), end(), *_protoPals);
		return colors;
	}